

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

size_t BIT_initDStream(BIT_DStream_t *bitD,void *srcBuffer,size_t srcSize)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t *psVar4;
  ulong uVar5;
  size_t sStack_20;
  
  if (srcSize == 0) {
    bitD->ptr = (char *)0x0;
    bitD->start = (char *)0x0;
    bitD->bitContainer = 0;
    *(undefined8 *)&bitD->bitsConsumed = 0;
    bitD->limitPtr = (char *)0x0;
    sStack_20 = 0xffffffffffffffb8;
    srcSize = sStack_20;
  }
  else {
    bitD->start = (char *)srcBuffer;
    bitD->limitPtr = (char *)((long)srcBuffer + 8);
    if (srcSize < 8) {
      bitD->ptr = (char *)srcBuffer;
      uVar5 = (ulong)*srcBuffer;
      bitD->bitContainer = uVar5;
      switch(srcSize) {
      case 7:
        uVar5 = uVar5 | (ulong)*(byte *)((long)srcBuffer + 6) << 0x30;
        bitD->bitContainer = uVar5;
      case 6:
        uVar5 = uVar5 + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
        bitD->bitContainer = uVar5;
      case 5:
        uVar5 = uVar5 + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
        bitD->bitContainer = uVar5;
      case 4:
        uVar5 = uVar5 + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
        bitD->bitContainer = uVar5;
      case 3:
        uVar5 = uVar5 + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
        bitD->bitContainer = uVar5;
      case 2:
        bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 1) * 0x100 + uVar5;
      }
      bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
      if (bVar1 == 0) {
        bitD->bitsConsumed = 0;
        return 0xffffffffffffffec;
      }
      uVar3 = ZSTD_highbit32((uint)bVar1);
      uVar3 = uVar3 + (int)srcSize * 8;
      iVar2 = 0x48;
    }
    else {
      psVar4 = (size_t *)((long)srcBuffer + (srcSize - 8));
      bitD->ptr = (char *)psVar4;
      bitD->bitContainer = *psVar4;
      bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
      if (bVar1 == 0) {
        bitD->bitsConsumed = 0;
        return 0xffffffffffffffff;
      }
      uVar3 = ZSTD_highbit32((uint)bVar1);
      iVar2 = 8;
    }
    bitD->bitsConsumed = iVar2 - uVar3;
  }
  return srcSize;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}